

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restclient.cpp
# Opt level: O3

void __thiscall
YdiskRestClient::uploadFile(YdiskRestClient *this,string *path,ifstream *ifstream,BOOL overwrite)

{
  pointer pcVar1;
  Headers *headers;
  bool bVar2;
  Json *this_00;
  _Base_ptr *pp_Var3;
  SSL_METHOD *meth;
  runtime_error *this_01;
  long lVar4;
  char *this_02;
  Client *this_03;
  string url;
  smatch m;
  string server_url;
  shared_ptr<httplib::Response> r2;
  SSLClient cli2;
  shared_ptr<httplib::Response> r;
  string request_url;
  regex pattern;
  stringstream body;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_348;
  long local_340;
  Headers local_338;
  Json local_300;
  element_type local_2f0 [2];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  SSL_CTX *local_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined1 local_248 [16];
  Headers *local_238;
  undefined1 local_230 [24];
  Client *local_218 [2];
  undefined1 local_208 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1f0;
  undefined8 uStack_1e0;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_1d8;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [7];
  ios_base local_138 [264];
  
  local_348._M_current = (char *)&local_338;
  this_02 = "/v1/disk/resources/upload?path=";
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_348,"/v1/disk/resources/upload?path=","");
  url_encode((string *)local_1b8,(YdiskRestClient *)this_02,path);
  std::__cxx11::string::_M_append((char *)&local_348,local_1b8._0_8_);
  pcVar1 = local_1b8 + 0x10;
  if ((pointer)local_1b8._0_8_ != pcVar1) {
    operator_delete((void *)local_1b8._0_8_,
                    CONCAT71(local_1a8[0]._M_allocated_capacity._1_7_,local_1a8[0]._M_local_buf[0])
                    + 1);
  }
  std::__cxx11::string::append((char *)&local_348);
  std::__cxx11::string::append((char *)&local_348);
  local_208._16_8_ = 0;
  aStack_1f0._M_allocated_capacity = 0;
  aStack_1f0._8_8_ = (code *)0x0;
  uStack_1e0._0_4_ = 0;
  uStack_1e0._4_4_ = 0;
  this_03 = (Client *)local_248;
  httplib::Client::Get
            (this_03,(char *)this->http_client,(Headers *)local_348._M_current,
             (Progress *)&this->headers);
  if ((code *)aStack_1f0._8_8_ != (code *)0x0) {
    this_03 = (Client *)(local_208 + 0x10);
    (*(code *)aStack_1f0._8_8_)(this_03,this_03,3);
  }
  if (((Response *)local_248._0_8_ == (Response *)0x0) || (*(int *)(local_248._0_8_ + 0x20) != 200))
  {
    throw_response_error((YdiskRestClient *)this_03,(Response *)local_248._0_8_);
    local_2e0._0_8_ = local_248._0_8_;
  }
  else {
    local_1b8._8_8_ = 0;
    local_1a8[0]._M_local_buf[0] = '\0';
    local_1b8._0_8_ = pcVar1;
    json11::Json::parse(&local_300,(string *)(local_248._0_8_ + 0x58),(string *)local_1b8,STANDARD);
    local_2d0._0_8_ = local_2c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"href","");
    this_00 = json11::Json::operator[](&local_300,(string *)local_2d0);
    json11::Json::string_value_abi_cxx11_(this_00);
    std::__cxx11::string::_M_assign((string *)&local_348);
    if ((undefined1 *)local_2d0._0_8_ != local_2c0) {
      operator_delete((void *)local_2d0._0_8_,CONCAT71(local_2c0._1_7_,local_2c0[0]) + 1);
    }
    if (local_300.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_300.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((pointer)local_1b8._0_8_ != pcVar1) {
      operator_delete((void *)local_1b8._0_8_,
                      CONCAT71(local_1a8[0]._M_allocated_capacity._1_7_,local_1a8[0]._M_local_buf[0]
                              ) + 1);
    }
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::ostream::operator<<((ostream *)(local_1b8 + 0x10),(streambuf *)(ifstream + 0x10));
    local_300.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_2f0[0]._vptr_JsonValue._0_1_ = 0;
    local_230._0_8_ = 0;
    local_230[8] = '\0';
    local_338._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    local_338._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_338._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_338._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    local_300.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_2f0;
    local_238 = (Headers *)(local_230 + 8);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&local_1d8,"https://(.+?):443(/.+)",0x10);
    bVar2 = std::__detail::
            __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                      (local_348,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(local_348._M_current + local_340),
                       (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)&local_338._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                       &local_1d8,0);
    if (!bVar2) goto LAB_001401b9;
    lVar4 = (long)local_338._M_t._M_impl.super__Rb_tree_header._M_header._M_left -
            (long)local_338._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if ((lVar4 == 0) || (0xfffffffffffffffd < (lVar4 >> 3) * -0x5555555555555555 - 5U)) {
      pp_Var3 = (_Base_ptr *)
                ((long)local_338._M_t._M_impl.super__Rb_tree_header._M_header._M_parent +
                lVar4 + -0x48);
    }
    else {
      pp_Var3 = &(local_338._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_right;
    }
    if (*(char *)(pp_Var3 + 2) == '\x01') {
      local_2d0._0_8_ = local_2c0;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)local_2d0,*pp_Var3,pp_Var3[1]);
    }
    else {
      local_2d0._8_8_ = (pointer)0x0;
      local_2c0[0] = '\0';
      local_2d0._0_8_ = local_2c0;
    }
    std::__cxx11::string::operator=((string *)&local_300,(string *)local_2d0);
    if ((undefined1 *)local_2d0._0_8_ != local_2c0) {
      operator_delete((void *)local_2d0._0_8_,CONCAT71(local_2c0._1_7_,local_2c0[0]) + 1);
    }
    lVar4 = (long)local_338._M_t._M_impl.super__Rb_tree_header._M_header._M_left -
            (long)local_338._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if ((lVar4 == 0) || (0xfffffffffffffffc < (lVar4 >> 3) * -0x5555555555555555 - 6U)) {
      pp_Var3 = (_Base_ptr *)
                ((long)local_338._M_t._M_impl.super__Rb_tree_header._M_header._M_parent +
                lVar4 + -0x48);
    }
    else {
      pp_Var3 = &local_338._M_t._M_impl.super__Rb_tree_header._M_header._M_parent[1]._M_left;
    }
    if (*(char *)(pp_Var3 + 2) == '\x01') {
      local_2d0._0_8_ = local_2c0;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)local_2d0,*pp_Var3,pp_Var3[1]);
    }
    else {
      local_2d0._8_8_ = (pointer)0x0;
      local_2c0[0] = '\0';
      local_2d0._0_8_ = local_2c0;
    }
    std::__cxx11::string::operator=((string *)&local_238,(string *)local_2d0);
    if ((undefined1 *)local_2d0._0_8_ != local_2c0) {
      operator_delete((void *)local_2d0._0_8_,CONCAT71(local_2c0._1_7_,local_2c0[0]) + 1);
    }
    httplib::Client::Client
              ((Client *)local_2d0,
               (char *)local_300.m_ptr.
                       super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               0x1bb,300);
    local_2d0._0_8_ = &PTR__SSLClient_0016f298;
    local_270 = 0;
    uStack_268 = 0;
    local_260 = 0;
    uStack_258 = 0;
    local_250 = 0;
    meth = (SSL_METHOD *)TLS_client_method();
    local_278 = SSL_CTX_new(meth);
    headers = local_238;
    std::__cxx11::stringbuf::str();
    httplib::Client::Put
              ((Client *)local_2e0,local_2d0,headers,(string *)&this->headers,(char *)local_218);
    if (local_218[0] != (Client *)local_208) {
      operator_delete(local_218[0],local_208._0_8_ + 1);
    }
    this_03 = local_218[0];
    if (((Response *)local_2e0._0_8_ != (Response *)0x0) &&
       (*(int *)(local_2e0._0_8_ + 0x20) - 0xc9U < 2)) {
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e0._8_8_);
      }
      local_2d0._0_8_ = &PTR__SSLClient_0016f298;
      if (local_278 != (SSL_CTX *)0x0) {
        SSL_CTX_free(local_278);
      }
      local_2d0._0_8_ = &PTR__Client_0016f260;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_allocated_capacity != &local_288) {
        operator_delete((void *)local_298._M_allocated_capacity,local_288._M_allocated_capacity + 1)
        ;
      }
      if ((undefined1 *)local_2d0._8_8_ != local_2c0 + 8) {
        operator_delete((void *)local_2d0._8_8_,local_2c0._8_8_ + 1);
      }
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_1d8);
      if (local_338._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
        operator_delete(local_338._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                        (long)local_338._M_t._M_impl.super__Rb_tree_header._M_header._M_right -
                        (long)local_338._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
      }
      if (local_238 != (Headers *)(local_230 + 8)) {
        operator_delete(local_238,CONCAT71(local_230._9_7_,local_230[8]) + 1);
      }
      if (local_300.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          != local_2f0) {
        operator_delete(local_300.m_ptr.
                        super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        CONCAT71(local_2f0[0]._vptr_JsonValue._1_7_,
                                 local_2f0[0]._vptr_JsonValue._0_1_) + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(local_138);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._8_8_);
      }
      if ((Headers *)local_348._M_current != &local_338) {
        operator_delete(local_348._M_current,local_338._M_t._M_impl._0_8_ + 1);
      }
      return;
    }
  }
  throw_response_error((YdiskRestClient *)this_03,(Response *)local_2e0._0_8_);
LAB_001401b9:
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,"Error parsing file href for upload");
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void YdiskRestClient::uploadFile(std::string path, std::ifstream& ifstream, BOOL overwrite)
{
    std::string url("/v1/disk/resources/upload?path=");
    url += url_encode(path);
    url += "&overwrite=";
    url += (overwrite ? "true": "false");

    auto r = http_client->Get(url.c_str(), headers);
    if(r.get() && r->status==200){
        std::string error;
        const auto json = Json::parse(r->body, error);
        url = json["href"].string_value();
    } else {
        throw_response_error(r.get());
    }

    std::stringstream body;
    body << ifstream.rdbuf();

    std::string server_url, request_url;
    std::smatch m;
    auto pattern = std::regex("https://(.+?):443(/.+)");
    if (std::regex_search(url, m, pattern)) {
        server_url = m[1].str();
        request_url = m[2].str();
    } else {
        throw std::runtime_error("Error parsing file href for upload");
    }

    httplib::SSLClient cli2(server_url.c_str(), 443);
    auto r2 = cli2.Put(request_url.c_str(), headers, body.str(), "application/octet-stream");

    if(r2.get() && (r2->status==201 || r2->status==202)){
        return;
    } else {
        throw_response_error(r2.get());
    }
}